

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O0

spv_result_t spvTextToLiteral(char *textValue,spv_literal_t *pLiteral)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  value_t vVar6;
  ulonglong uVar7;
  double dVar8;
  double dVar9;
  uint32_t u32;
  uint64_t u64;
  int32_t i32;
  int64_t i64;
  float f;
  double d;
  char *val;
  size_t sStack_40;
  bool escaping;
  uint64_t index;
  size_t len;
  int local_28;
  bool isString;
  int numPeriods;
  bool isSigned;
  spv_literal_t *pLiteral_local;
  char *textValue_local;
  
  bVar2 = false;
  local_28 = 0;
  bVar1 = false;
  sVar4 = strlen(textValue);
  if (sVar4 == 0) {
    textValue_local._4_4_ = SPV_FAILED_MATCH;
  }
  else {
    for (sStack_40 = 0; sStack_40 < sVar4; sStack_40 = sStack_40 + 1) {
      iVar3 = (int)textValue[sStack_40];
      if (iVar3 == 0x2d) {
        if (sStack_40 == 0) {
          bVar2 = true;
        }
        else {
          bVar1 = true;
        }
      }
      else if (iVar3 == 0x2e) {
        local_28 = local_28 + 1;
      }
      else if (9 < iVar3 - 0x30U) {
        bVar1 = true;
        sStack_40 = sVar4;
      }
    }
    pLiteral->type = 99;
    if (((bVar1) || (1 < local_28)) || ((bVar2 && (sVar4 == 1)))) {
      if (((sVar4 < 2) || (*textValue != '\"')) || (textValue[sVar4 - 1] != '\"')) {
        return SPV_FAILED_MATCH;
      }
      bVar1 = false;
      for (d = (double)(textValue + 1); (char *)d != textValue + (sVar4 - 1);
          d = (double)((long)d + 1)) {
        if ((*(char *)d != '\\') || (bVar1)) {
          uVar5 = std::__cxx11::string::size();
          if (0x3fffb < uVar5) {
            return SPV_ERROR_OUT_OF_MEMORY;
          }
          std::__cxx11::string::push_back((char)pLiteral + '\x10');
          bVar1 = false;
        }
        else {
          bVar1 = true;
        }
      }
      pLiteral->type = SPV_LITERAL_TYPE_STRING;
    }
    else if (local_28 == 1) {
      dVar8 = strtod(textValue,(char **)0x0);
      dVar9 = (double)(float)dVar8;
      if ((dVar8 != dVar9) || (NAN(dVar8) || NAN(dVar9))) {
        pLiteral->type = SPV_LITERAL_TYPE_FLOAT_64;
        (pLiteral->value).d = dVar8;
      }
      else {
        pLiteral->type = SPV_LITERAL_TYPE_FLOAT_32;
        (pLiteral->value).f = (float)dVar8;
      }
    }
    else if (bVar2) {
      vVar6.i64 = strtoll(textValue,(char **)0x0,10);
      if (vVar6.i64 == vVar6.i32) {
        pLiteral->type = SPV_LITERAL_TYPE_INT_32;
        (pLiteral->value).i32 = vVar6.i32;
      }
      else {
        pLiteral->type = SPV_LITERAL_TYPE_INT_64;
        pLiteral->value = vVar6;
      }
    }
    else {
      uVar7 = strtoull(textValue,(char **)0x0,10);
      if (uVar7 == (uVar7 & 0xffffffff)) {
        pLiteral->type = SPV_LITERAL_TYPE_UINT_32;
        (pLiteral->value).i32 = (int32_t)uVar7;
      }
      else {
        pLiteral->type = SPV_LITERAL_TYPE_UINT_64;
        (pLiteral->value).u64 = uVar7;
      }
    }
    textValue_local._4_4_ = SPV_SUCCESS;
  }
  return textValue_local._4_4_;
}

Assistant:

spv_result_t spvTextToLiteral(const char* textValue, spv_literal_t* pLiteral) {
  bool isSigned = false;
  int numPeriods = 0;
  bool isString = false;

  const size_t len = strlen(textValue);
  if (len == 0) return SPV_FAILED_MATCH;

  for (uint64_t index = 0; index < len; ++index) {
    switch (textValue[index]) {
      case '0':
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
        break;
      case '.':
        numPeriods++;
        break;
      case '-':
        if (index == 0) {
          isSigned = true;
        } else {
          isString = true;
        }
        break;
      default:
        isString = true;
        index = len;  // break out of the loop too.
        break;
    }
  }

  pLiteral->type = spv_literal_type_t(99);

  if (isString || numPeriods > 1 || (isSigned && len == 1)) {
    if (len < 2 || textValue[0] != '"' || textValue[len - 1] != '"')
      return SPV_FAILED_MATCH;
    bool escaping = false;
    for (const char* val = textValue + 1; val != textValue + len - 1; ++val) {
      if ((*val == '\\') && (!escaping)) {
        escaping = true;
      } else {
        // Have to save space for the null-terminator
        if (pLiteral->str.size() >= SPV_LIMIT_LITERAL_STRING_BYTES_MAX)
          return SPV_ERROR_OUT_OF_MEMORY;
        pLiteral->str.push_back(*val);
        escaping = false;
      }
    }

    pLiteral->type = SPV_LITERAL_TYPE_STRING;
  } else if (numPeriods == 1) {
    double d = std::strtod(textValue, nullptr);
    float f = (float)d;
    if (d == (double)f) {
      pLiteral->type = SPV_LITERAL_TYPE_FLOAT_32;
      pLiteral->value.f = f;
    } else {
      pLiteral->type = SPV_LITERAL_TYPE_FLOAT_64;
      pLiteral->value.d = d;
    }
  } else if (isSigned) {
    int64_t i64 = strtoll(textValue, nullptr, 10);
    int32_t i32 = (int32_t)i64;
    if (i64 == (int64_t)i32) {
      pLiteral->type = SPV_LITERAL_TYPE_INT_32;
      pLiteral->value.i32 = i32;
    } else {
      pLiteral->type = SPV_LITERAL_TYPE_INT_64;
      pLiteral->value.i64 = i64;
    }
  } else {
    uint64_t u64 = strtoull(textValue, nullptr, 10);
    uint32_t u32 = (uint32_t)u64;
    if (u64 == (uint64_t)u32) {
      pLiteral->type = SPV_LITERAL_TYPE_UINT_32;
      pLiteral->value.u32 = u32;
    } else {
      pLiteral->type = SPV_LITERAL_TYPE_UINT_64;
      pLiteral->value.u64 = u64;
    }
  }

  return SPV_SUCCESS;
}